

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O0

bool __thiscall Filter::matchContent(Filter *this,string *line,Match *pmatch)

{
  reference this_00;
  pointer this_01;
  bool local_41;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  bool match;
  Match *pmatch_local;
  string *line_local;
  Filter *this_local;
  
  it._M_node._7_1_ =
       std::__cxx11::
       list<std::unique_ptr<Regex,_std::default_delete<Regex>_>,_std::allocator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>_>
       ::empty(&this->m_inContent);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<Regex,_std::default_delete<Regex>_>,_std::allocator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>_>
       ::begin(&this->m_inContent);
  while( true ) {
    local_41 = false;
    if ((it._M_node._7_1_ & 1) == 0) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::unique_ptr<Regex,_std::default_delete<Regex>_>,_std::allocator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>_>
           ::end(&this->m_inContent);
      local_41 = std::operator!=(&local_30,&local_38);
    }
    if (local_41 == false) break;
    this_00 = std::_List_const_iterator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>::
              operator*(&local_30);
    this_01 = std::unique_ptr<Regex,_std::default_delete<Regex>_>::operator->(this_00);
    it._M_node._7_1_ = Regex::match(this_01,line,pmatch);
    std::_List_const_iterator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>::operator++
              (&local_30);
  }
  return (bool)(it._M_node._7_1_ & 1);
}

Assistant:

bool Filter::matchContent(std::string const & line, Match * pmatch) const
{
    bool match = m_inContent.empty();

    // Include filters
    Regex::PtrList::const_iterator it = m_inContent.begin();
    for (; !match && it != m_inContent.end(); ++it) {
        match = (*it)->match(line, pmatch);
    }
    return match;
}